

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManComputeOverlap2One(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  int iVar1;
  int iVar2;
  int i;
  int *piVar3;
  long lVar4;
  
  vVisit->nSize = 0;
  lVar4 = 0;
  while( true ) {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (iVar1 <= lVar4) break;
    piVar3 = Gia_ObjLutFanins(p,iObj);
    Vec_StrWriteEntry(vLabel,piVar3[lVar4],'\x01');
    lVar4 = lVar4 + 1;
  }
  iVar1 = Gia_ManComputeOverlap2One_rec(p,iObj,vLabel,vVisit);
  lVar4 = 0;
  while( true ) {
    iVar2 = Gia_ObjLutSize(p,iObj);
    if (iVar2 <= lVar4) break;
    piVar3 = Gia_ObjLutFanins(p,iObj);
    Vec_StrWriteEntry(vLabel,piVar3[lVar4],'\0');
    lVar4 = lVar4 + 1;
  }
  for (iVar2 = 0; iVar2 < vVisit->nSize; iVar2 = iVar2 + 1) {
    i = Vec_IntEntry(vVisit,iVar2);
    Vec_StrWriteEntry(vLabel,i,'\0');
  }
  return iVar1;
}

Assistant:

int Gia_ManComputeOverlap2One( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    int iFan, k, Counter;
    Vec_IntClear( vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 1 );
    Counter = Gia_ManComputeOverlap2One_rec( p, iObj, vLabel, vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    Vec_IntForEachEntry( vVisit, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    return Counter;
}